

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.cpp
# Opt level: O2

void check_variant_value<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>,int>
               (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *var,
               int *val)

{
  undefined1 local_158 [16];
  AssertionHandler catchAssertionHandler;
  BinaryExpr<const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&,_const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&>
  local_100;
  strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
  local_d0;
  type_id local_c8;
  StringRef local_c0;
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  local_100.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_100.super_ITransientExpression.m_isBinaryExpression = true;
  local_100.super_ITransientExpression.m_result = false;
  local_100.super_ITransientExpression._10_6_ = 0;
  local_158._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_158._8_8_ = 0x31;
  Catch::StringRef::StringRef(&local_40,"var.has_value()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_100,(SourceLineInfo *)local_158,local_40,
             Normal);
  local_100.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_100.super_ITransientExpression._vptr_ITransientExpression._1_7_,
                (var->storage_).storage_.cur_type_.
                super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
                .value_ != 0);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_100);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_100.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_100.super_ITransientExpression.m_isBinaryExpression = true;
  local_100.super_ITransientExpression.m_result = false;
  local_100.super_ITransientExpression._10_6_ = 0;
  local_158._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_158._8_8_ = 0x32;
  Catch::StringRef::StringRef(&local_50,"var");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_100,(SourceLineInfo *)local_158,local_50,
             Normal);
  local_100.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)var;
  Catch::AssertionHandler::
  handleExpr<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>const&>
            (&catchAssertionHandler,
             (ExprLhs<const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&>
              *)&local_100);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_100.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_100.super_ITransientExpression.m_isBinaryExpression = true;
  local_100.super_ITransientExpression.m_result = false;
  local_100.super_ITransientExpression._10_6_ = 0;
  local_158._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_158._8_8_ = 0x35;
  Catch::StringRef::StringRef
            (&local_60,"var.type() == typename Variant::type_id(variant_type<T>{})");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_100,(SourceLineInfo *)local_158,local_60,
             Normal);
  local_d0.value_ =
       (var->storage_).storage_.cur_type_.
       super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
       .value_;
  local_158._0_8_ = &local_d0;
  local_c8.
  super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>.
  value_ = (strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
            )1;
  Catch::ExprLhs<type_safe::tagged_union<int,double,debugger_type>::type_id_const&>::operator==
            (&local_100,
             (ExprLhs<type_safe::tagged_union<int,double,debugger_type>::type_id_const&> *)local_158
             ,&local_c8);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_100.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_100.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_100.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_100.super_ITransientExpression.m_isBinaryExpression = true;
  local_100.super_ITransientExpression.m_result = false;
  local_100.super_ITransientExpression._10_6_ = 0;
  local_158._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_158._8_8_ = 0x36;
  Catch::StringRef::StringRef(&local_70,"var.has_value(variant_type<T>{})");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_100,(SourceLineInfo *)local_158,local_70,
             Normal);
  local_100.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_100.super_ITransientExpression._vptr_ITransientExpression._1_7_,
                (var->storage_).storage_.cur_type_.
                super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
                .value_ == 1);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_100);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_100.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_100.super_ITransientExpression.m_isBinaryExpression = true;
  local_100.super_ITransientExpression.m_result = false;
  local_100.super_ITransientExpression._10_6_ = 0;
  local_158._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_158._8_8_ = 0x39;
  Catch::StringRef::StringRef(&local_80,"var.value(variant_type<T>{}) == val");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_100,(SourceLineInfo *)local_158,local_80,
             Normal);
  type_safe::tagged_union<int,_double,_debugger_type>::check<int>
            ((tagged_union<int,_double,_debugger_type> *)var);
  local_158._0_8_ = var;
  Catch::ExprLhs<int_const&>::operator==
            ((BinaryExpr<const_int_&,_const_int_&> *)&local_100,(ExprLhs<int_const&> *)local_158,val
            );
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_100.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_100.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_100.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_100.super_ITransientExpression.m_isBinaryExpression = true;
  local_100.super_ITransientExpression.m_result = false;
  local_100.super_ITransientExpression._10_6_ = 0;
  local_158._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_158._8_8_ = 0x40;
  Catch::StringRef::StringRef(&local_90,"!var.optional_value(variant_type<nullvar_t>{})");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_100,(SourceLineInfo *)local_158,local_90,
             Normal);
  local_100.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_100.super_ITransientExpression._vptr_ITransientExpression._1_7_,
                (var->storage_).storage_.cur_type_.
                super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
                .value_ != 0);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_100);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_100.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_100.super_ITransientExpression.m_isBinaryExpression = true;
  local_100.super_ITransientExpression.m_result = false;
  local_100.super_ITransientExpression._10_6_ = 0;
  local_158._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_158._8_8_ = 0x41;
  Catch::StringRef::StringRef
            (&local_a0,"bool(var.optional_value(variant_type<int>{})) == is_int::value");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_100,(SourceLineInfo *)local_158,local_a0,
             Normal);
  type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>::
  optional_value<int>((basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>
                       *)local_158,var);
  local_d0.value_._0_1_ = (char *)local_158._0_8_ != (char *)0x0;
  Catch::ExprLhs<bool>::operator==
            ((BinaryExpr<bool,_bool> *)&local_100,(ExprLhs<bool> *)&local_d0,true);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_100.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_100.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_100.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_100.super_ITransientExpression.m_isBinaryExpression = true;
  local_100.super_ITransientExpression.m_result = false;
  local_100.super_ITransientExpression._10_6_ = 0;
  local_158._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_158._8_8_ = 0x42;
  Catch::StringRef::StringRef
            (&local_b0,"bool(var.optional_value(variant_type<double>{})) == is_double::value");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_100,(SourceLineInfo *)local_158,local_b0,
             Normal);
  type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>::
  optional_value<double>
            ((basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *)
             local_158,var);
  local_d0.value_._0_1_ = (char *)local_158._0_8_ != (char *)0x0;
  Catch::ExprLhs<bool>::operator==
            ((BinaryExpr<bool,_bool> *)&local_100,(ExprLhs<bool> *)&local_d0,false);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_100.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_100.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_100.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_100.super_ITransientExpression.m_isBinaryExpression = true;
  local_100.super_ITransientExpression.m_result = false;
  local_100.super_ITransientExpression._10_6_ = 0;
  local_158._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_158._8_8_ = 0x43;
  Catch::StringRef::StringRef
            (&local_c0,"bool(var.optional_value(variant_type<debugger_type>{})) == is_dbg::value");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_100,(SourceLineInfo *)local_158,local_c0,
             Normal);
  type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>::
  optional_value<debugger_type>
            ((basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *)
             local_158,var);
  local_d0.value_._0_1_ = (char *)local_158._0_8_ != (char *)0x0;
  Catch::ExprLhs<bool>::operator==
            ((BinaryExpr<bool,_bool> *)&local_100,(ExprLhs<bool> *)&local_d0,false);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_100.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_100.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void check_variant_value(const Variant& var, const T& val)
{
    // boolean queries
    REQUIRE(var.has_value());
    REQUIRE(var);

    // type queries
    REQUIRE(var.type() == typename Variant::type_id(variant_type<T>{}));
    REQUIRE(var.has_value(variant_type<T>{}));

    // value query
    REQUIRE(var.value(variant_type<T>{}) == val);

    // optional_value queries
    using is_int    = std::is_same<T, int>;
    using is_double = std::is_same<T, double>;
    using is_dbg    = std::is_same<T, debugger_type>;

    REQUIRE(!var.optional_value(variant_type<nullvar_t>{}));
    REQUIRE(bool(var.optional_value(variant_type<int>{})) == is_int::value);
    REQUIRE(bool(var.optional_value(variant_type<double>{})) == is_double::value);
    REQUIRE(bool(var.optional_value(variant_type<debugger_type>{})) == is_dbg::value);
}